

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBoxButton::initStyleOption(QToolBoxButton *this,QStyleOptionToolBox *option)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QWidget *this_00;
  QStyleOption *in_RSI;
  QToolBox *in_RDI;
  long in_FS_OFFSET;
  int currIndex;
  int widgetCount;
  QToolBox *toolBox;
  QString *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  QWidget *in_stack_ffffffffffffffc0;
  QIcon local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QStyleOption *)0x0) {
    QStyleOption::initFrom(in_RSI,in_stack_ffffffffffffffc0);
    if (((byte)in_RDI[1].super_QFrame.super_QWidget.super_QObject & 1) != 0) {
      QFlags<QStyle::StateFlag>::operator|=(&in_RSI->state,State_Selected);
    }
    bVar1 = QAbstractButton::isDown((QAbstractButton *)in_RDI);
    if (bVar1) {
      QFlags<QStyle::StateFlag>::operator|=(&in_RSI->state,State_Sunken);
    }
    QAbstractButton::text
              ((QAbstractButton *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QString::operator=((QString *)in_RDI,in_stack_ffffffffffffffa8);
    QString::~QString((QString *)0x702af3);
    QAbstractButton::icon
              ((QAbstractButton *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QIcon::operator=((QIcon *)in_stack_ffffffffffffffc0,
                     (QIcon *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QIcon::~QIcon(local_28);
    this_00 = QWidget::parentWidget((QWidget *)0x702b29);
    iVar2 = QToolBox::count(in_RDI);
    iVar3 = QToolBox::currentIndex((QToolBox *)this_00);
    if (iVar2 == 1) {
      *(undefined4 *)&in_RSI[1].fontMetrics = 3;
    }
    else if (*(int *)&in_RDI[1].super_QFrame.super_QWidget.field_0x4 == 0) {
      *(undefined4 *)&in_RSI[1].fontMetrics = 0;
    }
    else if (*(int *)&in_RDI[1].super_QFrame.super_QWidget.field_0x4 == iVar2 + -1) {
      *(undefined4 *)&in_RSI[1].fontMetrics = 2;
    }
    else {
      *(undefined4 *)&in_RSI[1].fontMetrics = 1;
    }
    if (iVar3 == *(int *)&in_RDI[1].super_QFrame.super_QWidget.field_0x4 + -1) {
      *(undefined4 *)&in_RSI[1].field_0x24 = 2;
    }
    else if (iVar3 == *(int *)&in_RDI[1].super_QFrame.super_QWidget.field_0x4 + 1) {
      *(undefined4 *)&in_RSI[1].field_0x24 = 1;
    }
    else {
      *(undefined4 *)&in_RSI[1].field_0x24 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBoxButton::initStyleOption(QStyleOptionToolBox *option) const
{
    if (!option)
        return;
    option->initFrom(this);
    if (selected)
        option->state |= QStyle::State_Selected;
    if (isDown())
        option->state |= QStyle::State_Sunken;
    option->text = text();
    option->icon = icon();

    QToolBox *toolBox = static_cast<QToolBox *>(parentWidget()); // I know I'm in a tool box.
    const int widgetCount = toolBox->count();
    const int currIndex = toolBox->currentIndex();
    if (widgetCount == 1) {
        option->position = QStyleOptionToolBox::OnlyOneTab;
    } else if (indexInPage == 0) {
        option->position = QStyleOptionToolBox::Beginning;
    } else if (indexInPage == widgetCount - 1) {
        option->position = QStyleOptionToolBox::End;
    } else {
        option->position = QStyleOptionToolBox::Middle;
    }
    if (currIndex == indexInPage - 1) {
        option->selectedPosition = QStyleOptionToolBox::PreviousIsSelected;
    } else if (currIndex == indexInPage + 1) {
        option->selectedPosition = QStyleOptionToolBox::NextIsSelected;
    } else {
        option->selectedPosition = QStyleOptionToolBox::NotAdjacent;
    }
}